

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O3

unsigned_long
NonAdaptingProcess(PaUtilBufferProcessor *bp,int *streamCallbackResult,
                  PaUtilChannelDescriptor *hostInputChannels,
                  PaUtilChannelDescriptor *hostOutputChannels,unsigned_long framesToProcess)

{
  void **ppvVar1;
  void ***pppvVar2;
  long *plVar3;
  PaStreamCallbackTimeInfo *pPVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  PaUtilChannelDescriptor *pPVar11;
  PaUtilChannelDescriptor *pPVar12;
  ulong uVar13;
  void **ppvVar14;
  uint uVar15;
  ulong uVar16;
  void *pvVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  double dVar22;
  void **local_70;
  unsigned_long local_68;
  
  if (*streamCallbackResult == 0) {
    ppvVar1 = &bp->tempOutputBuffer;
    pppvVar2 = &bp->tempOutputBufferPtrs;
    local_68 = 0;
    bVar6 = false;
    bVar5 = false;
    do {
      uVar13 = bp->framesPerTempBuffer;
      if (framesToProcess <= bp->framesPerTempBuffer) {
        uVar13 = framesToProcess;
      }
      uVar8 = bp->inputChannelCount;
      uVar19 = (ulong)uVar8;
      uVar15 = (uint)uVar13;
      if (uVar19 == 0) {
        local_70 = (void **)0x0;
      }
      else {
        ppvVar14 = (void **)bp->tempInputBuffer;
        uVar10 = bp->bytesPerUserInputSample;
        if (bp->userInputIsInterleaved == 0) {
          if (((bp->userInputSampleFormatIsEqualToHost == 0) || (bp->hostInputIsInterleaved != 0))
             || (bp->hostInputChannels[0]->data == (void *)0x0)) {
            uVar8 = 0;
            uVar16 = 0;
            do {
              bp->tempInputBufferPtrs[uVar16] = (void *)(uVar8 * uVar13 + (long)bp->tempInputBuffer)
              ;
              uVar16 = uVar16 + 1;
              uVar8 = uVar8 + uVar10;
            } while (uVar19 != uVar16);
          }
          else {
            lVar9 = 0;
            do {
              *(undefined8 *)((long)bp->tempInputBufferPtrs + lVar9) =
                   *(undefined8 *)((long)&hostInputChannels->data + lVar9 * 2);
              lVar9 = lVar9 + 8;
            } while (uVar19 * 8 - lVar9 != 0);
            bVar5 = true;
          }
          uVar10 = uVar10 * uVar15;
          uVar8 = 1;
          local_70 = bp->tempInputBufferPtrs;
LAB_0010cdfe:
          if (bp->hostInputChannels[0]->data == (void *)0x0) {
LAB_0010ce54:
            uVar18 = 0;
            do {
              (*bp->inputZeroer)(ppvVar14,uVar8,uVar15);
              ppvVar14 = (void **)((long)ppvVar14 + (ulong)uVar10);
              uVar18 = uVar18 + 1;
            } while (uVar18 < bp->inputChannelCount);
          }
          else {
            if (bVar5) goto LAB_0010ce12;
            uVar19 = 0;
            pPVar11 = hostInputChannels;
            do {
              (*bp->inputConverter)
                        (ppvVar14,uVar8,pPVar11->data,pPVar11->stride,uVar15,&bp->ditherGenerator);
              ppvVar14 = (void **)((long)ppvVar14 + (ulong)uVar10);
              pPVar11->data =
                   (void *)((long)pPVar11->data +
                           (ulong)bp->bytesPerHostInputSample * pPVar11->stride * uVar13);
              uVar19 = uVar19 + 1;
              pPVar11 = pPVar11 + 1;
            } while (uVar19 < bp->inputChannelCount);
            bVar5 = false;
          }
        }
        else {
          local_70 = ppvVar14;
          if (((bp->userInputSampleFormatIsEqualToHost == 0) || (bp->hostInputIsInterleaved == 0))
             || ((bp->hostInputChannels[0]->data == (void *)0x0 ||
                 (uVar8 != hostInputChannels->stride)))) goto LAB_0010cdfe;
          ppvVar14 = (void **)hostInputChannels->data;
          local_70 = ppvVar14;
          if (bp->hostInputChannels[0]->data == (void *)0x0) {
            bVar5 = true;
            goto LAB_0010ce54;
          }
LAB_0010ce12:
          uVar8 = bp->bytesPerHostInputSample;
          lVar9 = 0;
          do {
            plVar3 = (long *)((long)&hostInputChannels->data + lVar9);
            *plVar3 = *plVar3 + (ulong)*(uint *)((long)&hostInputChannels->stride + lVar9) *
                                uVar8 * uVar13;
            lVar9 = lVar9 + 0x10;
          } while (uVar19 << 4 != lVar9);
          bVar5 = true;
        }
      }
      uVar19 = (ulong)bp->outputChannelCount;
      if (uVar19 == 0) {
        pvVar17 = (void *)0x0;
      }
      else {
        if (bp->userOutputIsInterleaved == 0) {
          if ((bp->userOutputSampleFormatIsEqualToHost == 0) || (bp->hostOutputIsInterleaved != 0))
          {
            uVar8 = bp->bytesPerUserOutputSample;
            uVar10 = 0;
            uVar16 = 0;
            do {
              (*pppvVar2)[uVar16] = (void *)(uVar10 * uVar13 + (long)*ppvVar1);
              uVar16 = uVar16 + 1;
              uVar10 = uVar10 + uVar8;
              pPVar11 = (PaUtilChannelDescriptor *)pppvVar2;
            } while (uVar19 != uVar16);
            goto LAB_0010cf66;
          }
          lVar9 = 0;
          do {
            *(undefined8 *)((long)*pppvVar2 + lVar9) =
                 *(undefined8 *)((long)&hostOutputChannels->data + lVar9 * 2);
            lVar9 = lVar9 + 8;
          } while (uVar19 << 3 != lVar9);
          pPVar12 = (PaUtilChannelDescriptor *)pppvVar2;
          bVar20 = true;
        }
        else {
          pPVar11 = (PaUtilChannelDescriptor *)ppvVar1;
          if (((bp->userOutputSampleFormatIsEqualToHost == 0) || (bp->hostOutputIsInterleaved == 0))
             || (pPVar12 = hostOutputChannels, bVar20 = true,
                bp->outputChannelCount != hostOutputChannels->stride)) {
LAB_0010cf66:
            pPVar12 = pPVar11;
            bVar20 = bVar6;
          }
        }
        bVar6 = bVar20;
        pvVar17 = pPVar12->data;
      }
      iVar7 = (*bp->streamCallback)
                        (local_70,pvVar17,uVar13,bp->timeInfo,bp->callbackStatusFlags,bp->userData);
      *streamCallbackResult = iVar7;
      if (iVar7 != 2) {
        auVar21._8_4_ = (int)(uVar13 >> 0x20);
        auVar21._0_8_ = uVar13;
        auVar21._12_4_ = 0x45300000;
        pPVar4 = bp->timeInfo;
        dVar22 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar15) - 4503599627370496.0)) * bp->samplePeriod;
        pPVar4->inputBufferAdcTime = pPVar4->inputBufferAdcTime + dVar22;
        pPVar4->outputBufferDacTime = dVar22 + pPVar4->outputBufferDacTime;
        uVar8 = bp->outputChannelCount;
        if (((ulong)uVar8 != 0) && (bp->hostOutputChannels[0]->data != (void *)0x0)) {
          if (bVar6) {
            uVar15 = bp->bytesPerHostOutputSample;
            lVar9 = 0;
            do {
              plVar3 = (long *)((long)&hostOutputChannels->data + lVar9);
              *plVar3 = *plVar3 + (ulong)*(uint *)((long)&hostOutputChannels->stride + lVar9) *
                                  uVar15 * uVar13;
              lVar9 = lVar9 + 0x10;
            } while ((ulong)uVar8 << 4 != lVar9);
          }
          else {
            bVar20 = bp->userOutputIsInterleaved == 0;
            if (bVar20) {
              uVar8 = 1;
            }
            pvVar17 = bp->tempOutputBuffer;
            uVar10 = 1;
            if (bVar20) {
              uVar10 = uVar15;
            }
            uVar18 = bp->bytesPerUserOutputSample;
            uVar19 = 0;
            pPVar11 = hostOutputChannels;
            do {
              (*bp->outputConverter)
                        (pPVar11->data,pPVar11->stride,pvVar17,uVar8,uVar15,&bp->ditherGenerator);
              pvVar17 = (void *)((long)pvVar17 + (ulong)(uVar10 * uVar18));
              pPVar11->data =
                   (void *)((long)pPVar11->data +
                           (ulong)bp->bytesPerHostOutputSample * pPVar11->stride * uVar13);
              uVar19 = uVar19 + 1;
              pPVar11 = pPVar11 + 1;
            } while (uVar19 < bp->outputChannelCount);
          }
        }
        local_68 = local_68 + uVar13;
        framesToProcess = framesToProcess - uVar13;
      }
      if (framesToProcess == 0) {
        return local_68;
      }
    } while (*streamCallbackResult == 0);
  }
  else {
    local_68 = 0;
    if (framesToProcess == 0) {
      return 0;
    }
  }
  if ((bp->outputChannelCount != 0) && (bp->hostOutputChannels[0]->data != (void *)0x0)) {
    uVar13 = 0;
    do {
      (*bp->outputZeroer)(hostOutputChannels->data,hostOutputChannels->stride,(uint)framesToProcess)
      ;
      hostOutputChannels->data =
           (void *)((long)hostOutputChannels->data +
                   (ulong)bp->bytesPerHostOutputSample *
                   hostOutputChannels->stride * framesToProcess);
      uVar13 = uVar13 + 1;
      hostOutputChannels = hostOutputChannels + 1;
    } while (uVar13 < bp->outputChannelCount);
  }
  return local_68 + framesToProcess;
}

Assistant:

static unsigned long NonAdaptingProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult,
        PaUtilChannelDescriptor *hostInputChannels,
        PaUtilChannelDescriptor *hostOutputChannels,
        unsigned long framesToProcess )
{
    void *userInput, *userOutput;
    unsigned char *srcBytePtr, *destBytePtr;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;
    unsigned long frameCount;
    unsigned long framesToGo = framesToProcess;
    unsigned long framesProcessed = 0;
    int skipOutputConvert = 0;
    int skipInputConvert = 0;


    if( *streamCallbackResult == paContinue )
    {
        do
        {
            frameCount = PA_MIN_( bp->framesPerTempBuffer, framesToGo );

            /* configure user input buffer and convert input data (host -> user) */
            if( bp->inputChannelCount == 0 )
            {
                /* no input */
                userInput = 0;
            }
            else /* there are input channels */
            {

                destBytePtr = (unsigned char *)bp->tempInputBuffer;

                if( bp->userInputIsInterleaved )
                {
                    destSampleStrideSamples = bp->inputChannelCount;
                    destChannelStrideBytes = bp->bytesPerUserInputSample;

                    /* process host buffer directly, or use temp buffer if formats differ or host buffer non-interleaved,
                     * or if num channels differs between the host (set in stride) and the user (eg with some Alsa hw:) */
                    if( bp->userInputSampleFormatIsEqualToHost && bp->hostInputIsInterleaved
                        && bp->hostInputChannels[0][0].data && bp->inputChannelCount == hostInputChannels[0].stride )
                    {
                            userInput = hostInputChannels[0].data;
                            destBytePtr = (unsigned char *)hostInputChannels[0].data;
                        skipInputConvert = 1;
                        }
                    else
                    {
                        userInput = bp->tempInputBuffer;
                    }
                }
                else /* user input is not interleaved */
                {
                    destSampleStrideSamples = 1;
                    destChannelStrideBytes = frameCount * bp->bytesPerUserInputSample;

                    /* setup non-interleaved ptrs */
                    if( bp->userInputSampleFormatIsEqualToHost && !bp->hostInputIsInterleaved && bp->hostInputChannels[0][0].data )
                    {
                    for( i=0; i<bp->inputChannelCount; ++i )
                    {
                            bp->tempInputBufferPtrs[i] = hostInputChannels[i].data;
                        }
                        skipInputConvert = 1;
                    }
                    else
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                        bp->tempInputBufferPtrs[i] = ((unsigned char*)bp->tempInputBuffer) +
                            i * bp->bytesPerUserInputSample * frameCount;
                    }
                    }

                    userInput = bp->tempInputBufferPtrs;
                }

                if( !bp->hostInputChannels[0][0].data )
                {
                    /* no input was supplied (see PaUtil_SetNoInput), so
                        zero the input buffer */

                    for( i=0; i<bp->inputChannelCount; ++i )
                    {
                        bp->inputZeroer( destBytePtr, destSampleStrideSamples, frameCount );
                        destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */
                    }
                }
                else
                {
                    if( skipInputConvert )
                    {
                    for( i=0; i<bp->inputChannelCount; ++i )
                    {
                            /* advance src ptr for next iteration */
                            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
                        }
                    }
                    else
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                        bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                                hostInputChannels[i].data,
                                                hostInputChannels[i].stride,
                                                frameCount, &bp->ditherGenerator );

                        destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */

                        /* advance src ptr for next iteration */
                        hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                                frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
                    }
                }
            }
            }

            /* configure user output buffer */
            if( bp->outputChannelCount == 0 )
            {
                /* no output */
                userOutput = 0;
            }
            else /* there are output channels */
            {
                if( bp->userOutputIsInterleaved )
                {
                    /* process host buffer directly, or use temp buffer if formats differ or host buffer non-interleaved,
                     * or if num channels differs between the host (set in stride) and the user (eg with some Alsa hw:) */
                    if( bp->userOutputSampleFormatIsEqualToHost && bp->hostOutputIsInterleaved
                            && bp->outputChannelCount == hostOutputChannels[0].stride )
                    {
                            userOutput = hostOutputChannels[0].data;
                        skipOutputConvert = 1;
                        }
                    else
                    {
                        userOutput = bp->tempOutputBuffer;
                    }
                }
                else /* user output is not interleaved */
                {
                    if( bp->userOutputSampleFormatIsEqualToHost && !bp->hostOutputIsInterleaved )
                    {
                    for( i = 0; i < bp->outputChannelCount; ++i )
                    {
                            bp->tempOutputBufferPtrs[i] = hostOutputChannels[i].data;
                        }
                        skipOutputConvert = 1;
                    }
                    else
                    {
                        for( i=0; i<bp->outputChannelCount; ++i )
                        {
                        bp->tempOutputBufferPtrs[i] = ((unsigned char*)bp->tempOutputBuffer) +
                            i * bp->bytesPerUserOutputSample * frameCount;
                    }
                    }

                    userOutput = bp->tempOutputBufferPtrs;
                }
            }

            *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                    frameCount, bp->timeInfo, bp->callbackStatusFlags, bp->userData );

            if( *streamCallbackResult == paAbort )
            {
                /* callback returned paAbort, don't advance framesProcessed
                        and framesToGo, they will be handled below */
            }
            else
            {
                bp->timeInfo->inputBufferAdcTime += frameCount * bp->samplePeriod;
                bp->timeInfo->outputBufferDacTime += frameCount * bp->samplePeriod;

                /* convert output data (user -> host) */

                if( bp->outputChannelCount != 0 && bp->hostOutputChannels[0][0].data )
                {
                    if( skipOutputConvert )
					{
						for( i=0; i<bp->outputChannelCount; ++i )
                    	{
                        	/* advance dest ptr for next iteration */
                        	hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                            	    frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
                    	}
					}
					else
					{

                    srcBytePtr = (unsigned char *)bp->tempOutputBuffer;

                    if( bp->userOutputIsInterleaved )
                    {
                        srcSampleStrideSamples = bp->outputChannelCount;
                        srcChannelStrideBytes = bp->bytesPerUserOutputSample;
                    }
                    else /* user output is not interleaved */
                    {
                        srcSampleStrideSamples = 1;
                        srcChannelStrideBytes = frameCount * bp->bytesPerUserOutputSample;
                    }

                    for( i=0; i<bp->outputChannelCount; ++i )
                    {
                        bp->outputConverter(    hostOutputChannels[i].data,
                                                hostOutputChannels[i].stride,
                                                srcBytePtr, srcSampleStrideSamples,
                                                frameCount, &bp->ditherGenerator );

                        srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

                        /* advance dest ptr for next iteration */
                        hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                                frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
                    }
                }
                }

                framesProcessed += frameCount;

                framesToGo -= frameCount;
            }
        }
        while( framesToGo > 0  && *streamCallbackResult == paContinue );
    }

    if( framesToGo > 0 )
    {
        /* zero any remaining frames output. There will only be remaining frames
            if the callback has returned paComplete or paAbort */

        frameCount = framesToGo;

        if( bp->outputChannelCount != 0 && bp->hostOutputChannels[0][0].data )
        {
            for( i=0; i<bp->outputChannelCount; ++i )
            {
                bp->outputZeroer(   hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    frameCount );

                /* advance dest ptr for next iteration */
                hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                        frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
            }
        }

        framesProcessed += frameCount;
    }

    return framesProcessed;
}